

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# groups.c
# Opt level: O0

int comex_group_create(int n,int *pid_list,comex_group_t id_parent,comex_group_t *id_child)

{
  uint uVar1;
  uint uVar2;
  long in_RSI;
  int in_EDI;
  int high;
  MPI_Comm peer_comm;
  int remote_leader;
  int remote_ldr_pos;
  int tag;
  int local_ldr_pos;
  int lvl;
  MPI_Comm comm2;
  MPI_Comm comm1;
  MPI_Comm comm;
  MPI_Comm *comm_parent;
  MPI_Group *group_parent;
  comex_igroup_t *igroup_parent;
  MPI_Comm *comm_child;
  MPI_Group *group_child;
  comex_igroup_t *igroup_child;
  int grp_me;
  int status;
  int in_stack_ffffffffffffff6c;
  char *in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff7c;
  undefined4 in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff84;
  uint local_78;
  uint local_74;
  undefined8 local_70;
  undefined8 local_68;
  undefined8 local_60;
  MPI_Comm *local_58;
  MPI_Group *local_50;
  comex_igroup_t *local_48;
  undefined8 *local_40;
  undefined8 *local_38;
  long local_30;
  uint local_28;
  int local_24;
  long local_10;
  int local_8;
  
  local_30 = 0;
  local_38 = (undefined8 *)0x0;
  local_40 = (undefined8 *)0x0;
  local_48 = (comex_igroup_t *)0x0;
  local_50 = (MPI_Group *)0x0;
  local_58 = (MPI_Comm *)0x0;
  local_10 = in_RSI;
  local_8 = in_EDI;
  comex_create_group_and_igroup
            ((comex_group_t *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
             (comex_igroup_t **)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
  local_38 = (undefined8 *)(local_30 + 0x18);
  local_40 = (undefined8 *)(local_30 + 0x10);
  local_48 = comex_get_igroup_from_group(in_stack_ffffffffffffff6c);
  local_50 = &local_48->group;
  local_58 = &local_48->comm;
  local_24 = MPI_Group_incl(*local_50,local_8,local_10,local_38);
  if (local_24 != 0) {
    comex_error(in_stack_ffffffffffffff70,in_stack_ffffffffffffff6c);
  }
  local_74 = 1;
  MPI_Group_rank(*local_38,&local_28);
  if (local_28 != 0xffff8002) {
    if ((int)local_28 < 0) {
      __assert_fail("grp_me>=0",
                    "/workspace/llm4binary/github/license_c_cmakelists/GlobalArrays[P]ga/comex/src-mpi/groups.c"
                    ,0xe1,"int comex_group_create(int, int *, comex_group_t, comex_group_t *)");
    }
    MPI_Comm_dup(&ompi_mpi_comm_self,&local_60);
    local_78 = local_28;
    for (; (int)local_74 < local_8; local_74 = local_74 << 1) {
      uVar1 = local_78 ^ local_74;
      if ((int)uVar1 < local_8) {
        uVar2 = (uint)((int)uVar1 <= (int)local_78);
        MPI_Intercomm_create
                  (local_60,0,*local_58,*(undefined4 *)(local_10 + (long)(int)uVar1 * 4),0,&local_68
                  );
        MPI_Comm_free(&local_60);
        MPI_Intercomm_merge(local_68,uVar2,&local_70);
        MPI_Comm_free(&local_68);
        local_60 = local_70;
      }
      local_78 = (local_74 ^ 0xffffffff) & local_78;
    }
    *local_40 = local_60;
    MPI_Group_free(local_38);
    MPI_Comm_group(*local_40,local_38);
  }
  return 0;
}

Assistant:

int comex_group_create(
        int n, int *pid_list, comex_group_t id_parent, comex_group_t *id_child)
{
    int status;
    int grp_me;
    comex_igroup_t *igroup_child = NULL;
    MPI_Group      *group_child = NULL;
    MPI_Comm       *comm_child = NULL;
    comex_igroup_t *igroup_parent = NULL;
    MPI_Group      *group_parent = NULL;
    MPI_Comm       *comm_parent = NULL;

    /* create the node in the linked list of groups and */
    /* get the child's MPI_Group and MPI_Comm, to be populated shortly */
    comex_create_group_and_igroup(id_child, &igroup_child);
    group_child = &(igroup_child->group);
    comm_child  = &(igroup_child->comm);

    /* get the parent's MPI_Group and MPI_Comm */
    igroup_parent = comex_get_igroup_from_group(id_parent);
    group_parent = &(igroup_parent->group);
    comm_parent  = &(igroup_parent->comm);

    status = MPI_Group_incl(*group_parent, n, pid_list, group_child);
    if (status != MPI_SUCCESS) {
        comex_error("MPI_Group_incl: Failed ", status);
    }

    {
        MPI_Comm comm, comm1, comm2;
        int lvl=1, local_ldr_pos;
        MPI_Group_rank(*group_child, &grp_me);
        if (grp_me == MPI_UNDEFINED) {
            /* FIXME: keeping the group around for now */
            return COMEX_SUCCESS;
        }
        /* SK: sanity check for the following bitwise operations */
        assert(grp_me>=0);
        MPI_Comm_dup(MPI_COMM_SELF, &comm); /* FIXME: can be optimized away */
        local_ldr_pos = grp_me;
        while(n>lvl) {
            int tag=0;
            int remote_ldr_pos = local_ldr_pos^lvl;
            if (remote_ldr_pos < n) {
                int remote_leader = pid_list[remote_ldr_pos];
                MPI_Comm peer_comm = *comm_parent;
                int high = (local_ldr_pos<remote_ldr_pos)?0:1;
                MPI_Intercomm_create(
                        comm, 0, peer_comm, remote_leader, tag, &comm1);
                MPI_Comm_free(&comm);
                MPI_Intercomm_merge(comm1, high, &comm2);
                MPI_Comm_free(&comm1);
                comm = comm2;
            }
            local_ldr_pos &= ((~0)^lvl);
            lvl<<=1;
        }
        *comm_child = comm;
        /* cleanup temporary group (from MPI_Group_incl above) */
        MPI_Group_free(group_child);
        /* get the actual group associated with comm */
        MPI_Comm_group(*comm_child, group_child);
    }

    return COMEX_SUCCESS;
}